

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O3

shared_ptr<helics::CallbackFederate> getCallbackFedSharedPtr(HelicsFederate fed,HelicsError *err)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  FedObject *pFVar3;
  HelicsError *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  undefined1 auVar5 [16];
  shared_ptr<helics::CallbackFederate> sVar6;
  
  pFVar3 = helics::getFedObject(err,in_RDX);
  _Var4._M_pi = extraout_RDX;
  if (pFVar3 != (FedObject *)0x0) {
    if ((pFVar3->type == CALLBACK) &&
       (peVar1 = (pFVar3->fedptr).super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr, peVar1 != (element_type *)0x0)) {
      auVar5 = __dynamic_cast(peVar1,&helics::Federate::typeinfo,&helics::CallbackFederate::typeinfo
                              ,0xffffffffffffffff);
      _Var4._M_pi = auVar5._8_8_;
      if (auVar5._0_8_ != 0) {
        *(long *)fed = auVar5._0_8_;
        p_Var2 = (pFVar3->fedptr).super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
        *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)fed + 8) = p_Var2;
        if (p_Var2 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_0019cb48;
        if (__libc_single_threaded != '\0') {
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          goto LAB_0019cb48;
        }
        LOCK();
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        UNLOCK();
        if (*fed != 0) goto LAB_0019cb48;
        if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)fed + 8) !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)fed + 8));
          _Var4._M_pi = extraout_RDX_00;
        }
      }
    }
    if (in_RDX != (HelicsError *)0x0) {
      in_RDX->error_code = -3;
      in_RDX->message = "Federate must be a callback federate";
    }
  }
  *(undefined8 *)fed = 0;
  *(undefined8 *)((long)fed + 8) = 0;
LAB_0019cb48:
  sVar6.super___shared_ptr<helics::CallbackFederate,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  sVar6.super___shared_ptr<helics::CallbackFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)fed;
  return (shared_ptr<helics::CallbackFederate>)
         sVar6.super___shared_ptr<helics::CallbackFederate,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<helics::CallbackFederate> getCallbackFedSharedPtr(HelicsFederate fed, HelicsError* err)
{
    auto* fedObj = helics::getFedObject(fed, err);
    if (fedObj == nullptr) {
        return nullptr;
    }
    if (fedObj->type == helics::FederateType::CALLBACK) {
        auto rval = std::dynamic_pointer_cast<helics::CallbackFederate>(fedObj->fedptr);
        if (rval) {
            return rval;
        }
    }
    assignError(err, HELICS_ERROR_INVALID_OBJECT, notCallbackFedString);
    return nullptr;
}